

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weighted_digraph_algorithm.h
# Opt level: O2

void __thiscall
my_algorithm::WeightedDigraphSPAcyclic<int,_int>::WeightedDigraphSPAcyclic
          (WeightedDigraphSPAcyclic<int,_int> *this,WeightedDigraph<int,_int> *graph)

{
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar1;
  pointer ppRVar2;
  bool bVar3;
  pointer ppRVar4;
  vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  *__range2;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *node;
  vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  nodes;
  WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>
  local_60;
  _Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  local_48;
  
  this->_vptr_WeightedDigraphSPAcyclic = (_func_int **)&PTR__WeightedDigraphSPAcyclic_0010bcc8;
  data_structures::
  SymbolTable<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
  ::SymbolTable(&this->_edge_to);
  data_structures::SymbolTable<int,_int>::SymbolTable(&this->_weight_to);
  (this->_reserve_post_nodes).
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_reserve_post_nodes).
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_marked_nodes).
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_reserve_post_nodes).
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_marked_nodes).
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_marked_nodes).
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  data_structures::RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::getAllNodes
            ((vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
              *)&local_48,&(graph->super_WeightedGraph<int,_int>)._tree);
  for (ppRVar4 = local_48._M_impl.super__Vector_impl_data._M_start;
      ppRVar4 != local_48._M_impl.super__Vector_impl_data._M_finish; ppRVar4 = ppRVar4 + 1) {
    local_60.from = *ppRVar4;
    bVar3 = isInVector<data_structures::RBTreeNode<data_structures::TreeElement<int,data_structures::WeightedGraphAdjSet<int,int>>>*>
                      (&this->_marked_nodes,&local_60.from);
    if (!bVar3) {
      _dfs(this,local_60.from);
    }
  }
  pRVar1 = *(this->_reserve_post_nodes).
            super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  this->_start = (pRVar1->element).key;
  data_structures::
  LinkedList<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  ::clear(&(this->_edge_to)._list);
  data_structures::LinkedList<data_structures::SymbolTableElement<int,_int>_>::clear
            (&(this->_weight_to)._list);
  local_60.weight = 0;
  local_60.from = pRVar1;
  local_60.to = pRVar1;
  data_structures::
  SymbolTable<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
  ::set(&this->_edge_to,&this->_start,&local_60);
  local_60.from =
       (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        *)((ulong)local_60.from & 0xffffffff00000000);
  data_structures::SymbolTable<int,_int>::set(&this->_weight_to,&this->_start,(int *)&local_60);
  ppRVar2 = (this->_reserve_post_nodes).
            super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppRVar4 = (this->_reserve_post_nodes).
                 super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppRVar4 != ppRVar2;
      ppRVar4 = ppRVar4 + 1) {
    _relax(this,graph,*ppRVar4);
  }
  std::
  _Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ::~_Vector_base(&local_48);
  return;
}

Assistant:

WeightedDigraphSPAcyclic(WeightedDigraph<T, Weight> &graph) {
            _marked_nodes.clear();
            _reserve_post_nodes.clear();
            auto nodes = graph.getAllNodes();
            // Topological sorting
            for (auto node: nodes) {
                if (!isInVector<Node*>(_marked_nodes, node)) {
                    _dfs(node);
                }
            }

            auto start_node = _reserve_post_nodes[0];
            _start = start_node->element.key;
            _edge_to.clear();
            _weight_to.clear();
            _edge_to.set(_start, Edge(start_node, start_node, Weight()));
            _weight_to.set(_start, Weight());

            for (auto node: _reserve_post_nodes) {
                _relax(graph, node);
            }
        }